

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

Relations __thiscall dg::vr::ValueRelations::_between(ValueRelations *this,Handle lt,Handle rt)

{
  mapped_type *pmVar1;
  ConstantInt *pCVar2;
  _Base_bitset<1UL> _Var3;
  _WordT *p_Var4;
  key_type local_60;
  bitset<12UL> local_58;
  _Link_type local_48;
  
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            ((RelationsMap *)&local_58,&this->graph,lt,(Relations *)&allRelations,false);
  local_60._M_data = rt;
  pmVar1 = std::
           map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
           ::operator[]((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                         *)&local_58,&local_60);
  _Var3._M_w = (pmVar1->bits).super__Base_bitset<1UL>._M_w;
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::_M_erase((_Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)&local_58,local_48);
  if (_Var3._M_w == 0) {
    pCVar2 = getInstance<llvm::ConstantInt>(this,rt);
    _Var3._M_w = (_WordT)_between(this,lt,pCVar2);
    if ((_Base_bitset<1UL>)_Var3._M_w == (_Base_bitset<1UL>)0x0) {
      pCVar2 = getInstance<llvm::ConstantInt>(this,lt);
      local_58.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)_between(this,rt,pCVar2);
      p_Var4 = (_WordT *)dg::vr::Relations::invert();
      _Var3._M_w = *p_Var4;
    }
  }
  return (Relations)_Var3._M_w;
}

Assistant:

Relations ValueRelations::_between(Handle lt, Handle rt) const {
    Relations result = graph.getRelated(lt, allRelations)[rt];
    if (result.any())
        return result;
    result = _between(lt, getInstance<llvm::ConstantInt>(rt));
    if (result.any())
        return result;
    return _between(getInstance<llvm::ConstantInt>(lt), rt);
}